

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CBufferSubData<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferSubData<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  uint in_R9D;
  uint valueMax;
  uint in_stack_fffffffffffffae8;
  allocator_type local_509;
  CDataArray dataRef;
  int dataHeight;
  int dataWidth;
  CDataArray dataTest;
  CDataArray dataSubRef;
  DIResult result;
  DILogger local_320;
  DILogger local_1a0;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,&dataWidth,&dataHeight);
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,4,0x46,in_R9D);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBufferSubData
            (this_00,0x8f3f,0,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,(long)(dataHeight * dataWidth),(value_type_conflict4 *)&dataSubRef,&local_509
            );
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x8f3f,0,
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  valueMax = dataHeight;
  lVar1 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     dataHeight,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     dataHeight,0,0,in_stack_fffffffffffffae8);
  DIResult::sub_result(&local_1a0,&result,lVar1);
  DILogger::~DILogger(&local_1a0);
  dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataSubRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)dataWidth / 2 & 0xffffffff),dataHeight / 2,0x50,0x5a,valueMax);
  glu::CallLogWrapper::glBufferSubData
            (this_00,0x8f3f,4,
             (long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + 1,
            dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start);
  }
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x8f3f,0,
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar1 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     dataHeight,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     dataHeight,0,0,in_stack_fffffffffffffae8);
  DIResult::sub_result(&local_320,&result,lVar1);
  DILogger::~DILogger(&local_320);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataSubRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 4, 70);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), NULL,
					 GL_DYNAMIC_DRAW);
		glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0]);

		CDataArray dataTest(dataWidth * dataHeight, 0);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataSubRef;
		DataGen<unsigned int>(dataSubRef, dataWidth / 2, dataHeight / 2, 80, 90);
		glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 4, (GLsizeiptr)(dataSubRef.size() * sizeof(unsigned int)),
						&dataSubRef[0]);
		std::copy(dataSubRef.begin(), dataSubRef.end(), dataRef.begin() + 1);

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		return result.code();
	}